

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O2

unique_ptr<void_*[],_std::default_delete<void_*[]>_> __thiscall
StackTraceTableTestHelper::DumpTraces(StackTraceTableTestHelper *this)

{
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  *in_RSI;
  
  tcmalloc::ProduceStackTracesDump
            ((tcmalloc *)this,DumpTraces::anon_class_1_0_00000001::__invoke,
             (in_RSI->_M_t).
             super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
             .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl);
  std::
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::reset(in_RSI,(pointer)0x0);
  return (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
         (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<void*[]> DumpTraces() {
    auto retval = ProduceStackTracesDump(
      +[] (const void** current_head) {
        const Entry* head = static_cast<const Entry*>(*current_head);
        *current_head = head->next.get();
        return &head->trace;
      }, head_.get());

    head_.reset();
    return retval;
  }